

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void EmitDestructuredRestArray
               (ParseNode *elem,RegSlot iteratorLocation,RegSlot nextMethodReg,
               RegSlot shouldCallReturnFunctionLocation,
               RegSlot shouldCallReturnFunctionLocationFinally,ByteCodeGenerator *byteCodeGenerator,
               FuncInfo *funcInfo)

{
  ByteCodeWriter *pBVar1;
  RegSlot R0;
  ParseNode *elem_00;
  bool bVar2;
  OpCode op;
  RegSlot R0_00;
  RegSlot RVar3;
  ByteCodeLabel labelID;
  RegSlot resultReg;
  ByteCodeLabel labelID_00;
  RegSlot resultReg_00;
  ParseNodeUni *pPVar4;
  
  R0_00 = FuncInfo::AcquireTmpRegister(funcInfo);
  pPVar4 = ParseNode::AsParseNodeUni(elem);
  if ((pPVar4->pnode1->nop & ~knopInt) != knopObjectPattern) {
    pPVar4 = ParseNode::AsParseNodeUni(elem);
    if ((byte)(pPVar4->pnode1->nop + ~knopLetDecl) < 0xfd) {
      pBVar1 = &byteCodeGenerator->m_writer;
      Js::ByteCodeWriter::Reg1(pBVar1,LdTrue_ReuseLoc,shouldCallReturnFunctionLocation);
      Js::ByteCodeWriter::Reg1(pBVar1,LdTrue_ReuseLoc,shouldCallReturnFunctionLocationFinally);
      pPVar4 = ParseNode::AsParseNodeUni(elem);
      EmitReference(pPVar4->pnode1,byteCodeGenerator,funcInfo);
      Js::ByteCodeWriter::Reg1(pBVar1,LdFalse_ReuseLoc,shouldCallReturnFunctionLocation);
      Js::ByteCodeWriter::Reg1(pBVar1,LdFalse_ReuseLoc,shouldCallReturnFunctionLocationFinally);
      bVar2 = true;
      goto LAB_00767520;
    }
  }
  bVar2 = false;
LAB_00767520:
  pBVar1 = &byteCodeGenerator->m_writer;
  Js::ByteCodeWriter::Reg1Unsigned1(pBVar1,NewScArray,R0_00,0);
  R0 = elem->location;
  RVar3 = ByteCodeGenerator::EnregisterConstant(byteCodeGenerator,0);
  Js::ByteCodeWriter::Reg2(pBVar1,Ld_A,R0,RVar3);
  labelID = Js::ByteCodeWriter::DefineLabel(pBVar1);
  Js::ByteCodeWriter::MarkLabel(pBVar1,labelID);
  RVar3 = FuncInfo::AcquireTmpRegister(funcInfo);
  EmitFunctionCall(RVar3,nextMethodReg,iteratorLocation,byteCodeGenerator,funcInfo);
  EmitThrowOnNotObject(RVar3,byteCodeGenerator);
  resultReg = FuncInfo::AcquireTmpRegister(funcInfo);
  EmitGetObjectProperty(resultReg,RVar3,0x74,byteCodeGenerator,funcInfo);
  labelID_00 = Js::ByteCodeWriter::DefineLabel(pBVar1);
  Js::ByteCodeWriter::BrReg1(pBVar1,BrTrue_A,labelID_00,resultReg);
  resultReg_00 = FuncInfo::AcquireTmpRegister(funcInfo);
  EmitGetObjectProperty(resultReg_00,RVar3,0x197,byteCodeGenerator,funcInfo);
  Js::ByteCodeWriter::Reg1(pBVar1,LdTrue_ReuseLoc,shouldCallReturnFunctionLocation);
  Js::ByteCodeWriter::Reg1(pBVar1,LdTrue_ReuseLoc,shouldCallReturnFunctionLocationFinally);
  op = ByteCodeGenerator::GetStElemIOpCode(funcInfo);
  Js::ByteCodeWriter::Element(pBVar1,op,resultReg_00,R0_00,R0,false,false);
  FuncInfo::ReleaseTmpRegister(funcInfo,resultReg_00);
  FuncInfo::ReleaseTmpRegister(funcInfo,resultReg);
  FuncInfo::ReleaseTmpRegister(funcInfo,RVar3);
  Js::ByteCodeWriter::Reg2(pBVar1,Incr_A,R0,R0);
  Js::ByteCodeWriter::Reg1(pBVar1,LdFalse_ReuseLoc,shouldCallReturnFunctionLocation);
  Js::ByteCodeWriter::Reg1(pBVar1,LdFalse_ReuseLoc,shouldCallReturnFunctionLocationFinally);
  Js::ByteCodeWriter::Br(pBVar1,labelID);
  Js::ByteCodeWriter::MarkLabel(pBVar1,labelID_00);
  pPVar4 = ParseNode::AsParseNodeUni(elem);
  elem_00 = pPVar4->pnode1;
  if (bVar2) {
    EmitAssignment((ParseNode *)0x0,elem_00,R0_00,byteCodeGenerator,funcInfo);
    FuncInfo::ReleaseReference(funcInfo,elem_00);
  }
  else {
    EmitDestructuredElement(elem_00,R0_00,byteCodeGenerator,funcInfo);
  }
  FuncInfo::ReleaseTmpRegister(funcInfo,R0_00);
  return;
}

Assistant:

void EmitDestructuredRestArray(
    ParseNode* elem,
    Js::RegSlot iteratorLocation,
    Js::RegSlot nextMethodReg,
    Js::RegSlot shouldCallReturnFunctionLocation,
    Js::RegSlot shouldCallReturnFunctionLocationFinally,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo)
{
    Js::RegSlot restArrayLocation = funcInfo->AcquireTmpRegister();
    bool isAssignmentTarget = !(elem->AsParseNodeUni()->pnode1->IsPattern() || elem->AsParseNodeUni()->pnode1->IsVarLetOrConst());

    if (isAssignmentTarget)
    {
        byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdTrue_ReuseLoc, shouldCallReturnFunctionLocation);
        byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdTrue_ReuseLoc, shouldCallReturnFunctionLocationFinally);
        EmitReference(elem->AsParseNodeUni()->pnode1, byteCodeGenerator, funcInfo);
        byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdFalse_ReuseLoc, shouldCallReturnFunctionLocation);
        byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdFalse_ReuseLoc, shouldCallReturnFunctionLocationFinally);
    }

    byteCodeGenerator->Writer()->Reg1Unsigned1(
        Js::OpCode::NewScArray,
        restArrayLocation,
        ByteCodeGenerator::DefaultArraySize);

    // BytecodeGen can't convey to IRBuilder that some of the temporaries used here are live. When we
    // have a rest parameter, a counter is used in a loop for the array index, but there is no way to
    // convey this is live on the back edge.
    // As a workaround, we have a persistent var reg that is used for the loop counter
    Js::RegSlot counterLocation = elem->location;
    // TODO[ianhall]: Is calling EnregisterConstant() during Emit phase allowed?
    Js::RegSlot zeroConstantReg = byteCodeGenerator->EnregisterConstant(0);
    byteCodeGenerator->Writer()->Reg2(Js::OpCode::Ld_A, counterLocation, zeroConstantReg);

    // loopTop:
    Js::ByteCodeLabel loopTop = byteCodeGenerator->Writer()->DefineLabel();
    byteCodeGenerator->Writer()->MarkLabel(loopTop);

    Js::RegSlot itemLocation = funcInfo->AcquireTmpRegister();

    EmitFunctionCall(
        itemLocation,
        nextMethodReg,
        iteratorLocation,
        byteCodeGenerator,
        funcInfo);

    EmitThrowOnNotObject(itemLocation, byteCodeGenerator);

    Js::RegSlot doneLocation = funcInfo->AcquireTmpRegister();
    EmitGetObjectProperty(
        doneLocation,
        itemLocation,
        Js::PropertyIds::done,
        byteCodeGenerator,
        funcInfo);

    Js::ByteCodeLabel iteratorDone = byteCodeGenerator->Writer()->DefineLabel();
    byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrTrue_A, iteratorDone, doneLocation);

    Js::RegSlot valueLocation = funcInfo->AcquireTmpRegister();
    EmitGetObjectProperty(
        valueLocation,
        itemLocation,
        Js::PropertyIds::value,
        byteCodeGenerator,
        funcInfo);

    byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdTrue_ReuseLoc, shouldCallReturnFunctionLocation);
    byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdTrue_ReuseLoc, shouldCallReturnFunctionLocationFinally);

    byteCodeGenerator->Writer()->Element(
        ByteCodeGenerator::GetStElemIOpCode(funcInfo),
        valueLocation, restArrayLocation, counterLocation);
    funcInfo->ReleaseTmpRegister(valueLocation);
    funcInfo->ReleaseTmpRegister(doneLocation);
    funcInfo->ReleaseTmpRegister(itemLocation);

    byteCodeGenerator->Writer()->Reg2(Js::OpCode::Incr_A, counterLocation, counterLocation);

    byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdFalse_ReuseLoc, shouldCallReturnFunctionLocation);
    byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdFalse_ReuseLoc, shouldCallReturnFunctionLocationFinally);

    byteCodeGenerator->Writer()->Br(loopTop);

    // iteratorDone:
    byteCodeGenerator->Writer()->MarkLabel(iteratorDone);

    ParseNode *restElem = elem->AsParseNodeUni()->pnode1;
    if (isAssignmentTarget)
    {
        EmitAssignment(nullptr, restElem, restArrayLocation, byteCodeGenerator, funcInfo);
        funcInfo->ReleaseReference(restElem);
    }
    else
    {
        EmitDestructuredElement(restElem, restArrayLocation, byteCodeGenerator, funcInfo);
    }

    funcInfo->ReleaseTmpRegister(restArrayLocation);
}